

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

bool __thiscall slang::parsing::Lexer::tryApplyCommentHandler(Lexer *this)

{
  byte *pbVar1;
  group_type_pointer pgVar2;
  char *pcVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  long lVar6;
  uint uVar7;
  byte bVar8;
  size_t sVar9;
  undefined1 uVar10;
  int iVar11;
  uint uVar12;
  uint64_t uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_type __rlen;
  ulong uVar17;
  ulong uVar18;
  size_type __rlen_1;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uchar uVar22;
  uchar uVar23;
  char cVar24;
  uchar uVar25;
  char cVar26;
  byte bVar27;
  uchar uVar28;
  char cVar29;
  uchar uVar30;
  char cVar31;
  uchar uVar32;
  char cVar33;
  byte bVar34;
  uchar uVar35;
  char cVar36;
  uchar uVar37;
  char cVar38;
  uchar uVar39;
  char cVar40;
  byte bVar41;
  uchar uVar42;
  char cVar43;
  uchar uVar44;
  char cVar45;
  uchar uVar46;
  char cVar47;
  byte bVar48;
  byte bVar49;
  size_t pos;
  size_t pos_1;
  value_type *elements;
  string_view firstWord;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  byte local_b8;
  char cStack_b7;
  char cStack_b6;
  byte bStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  byte bStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  byte bStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  byte bStack_a9;
  undefined8 local_a8;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  byte bStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  byte bStack_99;
  size_t local_98;
  char local_78;
  char cStack_77;
  char cStack_76;
  byte bStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  byte bStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  byte bStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  string_view local_40;
  
  local_c8._M_str = this->sourceBuffer;
  while ((bVar27 = *local_c8._M_str, bVar27 == 9 || (bVar27 == 0x20))) {
    local_c8._M_str = (char *)((byte *)local_c8._M_str + 1);
    this->sourceBuffer = local_c8._M_str;
  }
  lVar15 = 1;
  while ((((0xf5 < (byte)(bVar27 - 0x3a) || (0xe5 < (byte)((bVar27 & 0xdf) + 0xa5))) ||
          (bVar27 == 0x5f)) || (bVar27 == 0x2d))) {
    this->sourceBuffer = (char *)((byte *)local_c8._M_str + lVar15);
    pbVar1 = (byte *)local_c8._M_str + lVar15;
    lVar15 = lVar15 + 1;
    bVar27 = *pbVar1;
  }
  local_c8._M_len = lVar15 - 1;
  uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->options,&local_c8);
  pcVar3 = local_c8._M_str;
  sVar9 = local_c8._M_len;
  uVar16 = uVar13 >> ((byte)(this->options).commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->options).commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_;
  lVar15 = (uVar13 & 0xff) * 4;
  uVar22 = (&UNK_00461acc)[lVar15];
  uVar23 = (&UNK_00461acd)[lVar15];
  uVar25 = (&UNK_00461ace)[lVar15];
  bVar27 = (&UNK_00461acf)[lVar15];
  ppVar5 = (this->options).commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.elements_;
  local_98 = (this->options).commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_size_mask;
  uVar18 = 0;
  uVar28 = uVar22;
  uVar30 = uVar23;
  uVar32 = uVar25;
  bVar34 = bVar27;
  uVar35 = uVar22;
  uVar37 = uVar23;
  uVar39 = uVar25;
  bVar41 = bVar27;
  uVar42 = uVar22;
  uVar44 = uVar23;
  uVar46 = uVar25;
  bVar48 = bVar27;
  do {
    pgVar2 = pgVar4 + uVar16;
    local_68 = pgVar2->m[0].n;
    uStack_67 = pgVar2->m[1].n;
    uStack_66 = pgVar2->m[2].n;
    bStack_65 = pgVar2->m[3].n;
    uStack_64 = pgVar2->m[4].n;
    uStack_63 = pgVar2->m[5].n;
    uStack_62 = pgVar2->m[6].n;
    bStack_61 = pgVar2->m[7].n;
    uStack_60 = pgVar2->m[8].n;
    uStack_5f = pgVar2->m[9].n;
    uStack_5e = pgVar2->m[10].n;
    bStack_5d = pgVar2->m[0xb].n;
    uStack_5c = pgVar2->m[0xc].n;
    uStack_5b = pgVar2->m[0xd].n;
    uStack_5a = pgVar2->m[0xe].n;
    local_b8 = pgVar2->m[0xf].n;
    auVar20[0] = -(local_68 == uVar22);
    auVar20[1] = -(uStack_67 == uVar23);
    auVar20[2] = -(uStack_66 == uVar25);
    auVar20[3] = -(bStack_65 == bVar27);
    auVar20[4] = -(uStack_64 == uVar28);
    auVar20[5] = -(uStack_63 == uVar30);
    auVar20[6] = -(uStack_62 == uVar32);
    auVar20[7] = -(bStack_61 == bVar34);
    auVar20[8] = -(uStack_60 == uVar35);
    auVar20[9] = -(uStack_5f == uVar37);
    auVar20[10] = -(uStack_5e == uVar39);
    auVar20[0xb] = -(bStack_5d == bVar41);
    auVar20[0xc] = -(uStack_5c == uVar42);
    auVar20[0xd] = -(uStack_5b == uVar44);
    auVar20[0xe] = -(uStack_5a == uVar46);
    auVar20[0xf] = -(local_b8 == bVar48);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      local_a8 = (char *)CONCAT17(bVar34,CONCAT16(uVar32,CONCAT15(uVar30,CONCAT14(uVar28,CONCAT13(
                                                  bVar27,CONCAT12(uVar25,CONCAT11(uVar23,uVar22)))))
                                                 ));
      uStack_a0 = uVar35;
      uStack_9f = uVar37;
      uStack_9e = uVar39;
      bStack_9d = bVar41;
      uStack_9c = uVar42;
      uStack_9b = uVar44;
      uStack_9a = uVar46;
      bStack_99 = bVar48;
      bStack_59 = local_b8;
      do {
        iVar11 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
          }
        }
        uVar19 = (ulong)(uint)(iVar11 << 6);
        if (sVar9 == *(size_t *)((long)&ppVar5[uVar16 * 0xf].first._M_len + uVar19)) {
          if (sVar9 == 0) {
LAB_002edc3a:
            local_40 = tryApplyCommentHandler::anon_class_8_1_8991fb9c::operator()
                                 ((anon_class_8_1_8991fb9c *)this);
            uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )((long)&ppVar5[uVar16 * 0xf].second.table_.
                                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                         .arrays.groups_size_index + uVar19),&local_40);
            uVar18 = uVar13 >> (*(byte *)((long)&ppVar5[uVar16 * 0xf].second.table_.
                                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                                 .arrays.groups_size_index + uVar19) & 0x3f);
            lVar6 = *(long *)((long)&ppVar5[uVar16 * 0xf].second.table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                     .arrays.groups_ + uVar19);
            lVar15 = (uVar13 & 0xff) * 4;
            bVar27 = (&UNK_00461acc)[lVar15];
            cVar24 = (&UNK_00461acd)[lVar15];
            cVar26 = (&UNK_00461ace)[lVar15];
            bVar34 = (&UNK_00461acf)[lVar15];
            sVar9 = local_40._M_len;
            local_a8 = local_40._M_str;
            uVar17 = 0;
            cVar29 = bVar27;
            cVar31 = cVar24;
            cVar33 = cVar26;
            bVar41 = bVar34;
            cVar36 = bVar27;
            cVar38 = cVar24;
            cVar40 = cVar26;
            bVar48 = bVar34;
            cVar43 = bVar27;
            cVar45 = cVar24;
            cVar47 = cVar26;
            bVar49 = bVar34;
            do {
              pcVar3 = (char *)(lVar6 + uVar18 * 0x10);
              local_78 = *pcVar3;
              cStack_77 = pcVar3[1];
              cStack_76 = pcVar3[2];
              bStack_75 = pcVar3[3];
              cStack_74 = pcVar3[4];
              cStack_73 = pcVar3[5];
              cStack_72 = pcVar3[6];
              bStack_71 = pcVar3[7];
              cStack_70 = pcVar3[8];
              cStack_6f = pcVar3[9];
              cStack_6e = pcVar3[10];
              bStack_6d = pcVar3[0xb];
              cStack_6c = pcVar3[0xc];
              cStack_6b = pcVar3[0xd];
              cStack_6a = pcVar3[0xe];
              bVar8 = pcVar3[0xf];
              auVar21[0] = -(local_78 == bVar27);
              auVar21[1] = -(cStack_77 == cVar24);
              auVar21[2] = -(cStack_76 == cVar26);
              auVar21[3] = -(bStack_75 == bVar34);
              auVar21[4] = -(cStack_74 == cVar29);
              auVar21[5] = -(cStack_73 == cVar31);
              auVar21[6] = -(cStack_72 == cVar33);
              auVar21[7] = -(bStack_71 == bVar41);
              auVar21[8] = -(cStack_70 == cVar36);
              auVar21[9] = -(cStack_6f == cVar38);
              auVar21[10] = -(cStack_6e == cVar40);
              auVar21[0xb] = -(bStack_6d == bVar48);
              auVar21[0xc] = -(cStack_6c == cVar43);
              auVar21[0xd] = -(cStack_6b == cVar45);
              auVar21[0xe] = -(cStack_6a == cVar47);
              auVar21[0xf] = -(bVar8 == bVar49);
              uVar12 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
              if (uVar12 != 0) {
                lVar15 = *(long *)((long)&ppVar5[uVar16 * 0xf].second.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                          .arrays.elements_ + uVar19) + uVar18 * 600;
                local_b8 = bVar27;
                cStack_b7 = cVar24;
                cStack_b6 = cVar26;
                bStack_b5 = bVar34;
                cStack_b4 = cVar29;
                cStack_b3 = cVar31;
                cStack_b2 = cVar33;
                bStack_b1 = bVar41;
                cStack_b0 = cVar36;
                cStack_af = cVar38;
                cStack_ae = cVar40;
                bStack_ad = bVar48;
                cStack_ac = cVar43;
                cStack_ab = cVar45;
                cStack_aa = cVar47;
                bStack_a9 = bVar49;
                bStack_69 = bVar8;
                do {
                  uVar7 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  uVar14 = (ulong)uVar7;
                  if ((sVar9 == *(size_t *)(lVar15 + uVar14 * 0x28)) &&
                     ((sVar9 == 0 ||
                      (iVar11 = bcmp(local_a8,*(void **)(lVar15 + 8 + uVar14 * 0x28),sVar9),
                      bVar27 = local_b8, cVar24 = cStack_b7, cVar26 = cStack_b6, bVar34 = bStack_b5,
                      cVar29 = cStack_b4, cVar31 = cStack_b3, cVar33 = cStack_b2, bVar41 = bStack_b1
                      , cVar36 = cStack_b0, cVar38 = cStack_af, cVar40 = cStack_ae,
                      bVar48 = bStack_ad, cVar43 = cStack_ac, cVar45 = cStack_ab, cVar47 = cStack_aa
                      , bVar49 = bStack_a9, iVar11 == 0)))) {
                    uVar10 = (*(code *)(&DAT_00479ab0 +
                                       *(int *)(&DAT_00479ab0 +
                                               (ulong)*(uint *)(uVar14 * 0x28 + lVar15 + 0x10) * 4))
                             )();
                    return (bool)uVar10;
                  }
                  uVar12 = uVar12 - 1 & uVar12;
                } while (uVar12 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar8) == 0) {
                return false;
              }
              uVar14 = *(ulong *)((long)&ppVar5[uVar16 * 0xf].second.table_.
                                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                         .arrays.groups_size_mask + uVar19);
              lVar15 = uVar18 + uVar17;
              uVar17 = uVar17 + 1;
              uVar18 = lVar15 + 1U & uVar14;
            } while (uVar17 <= uVar14);
            return false;
          }
          iVar11 = bcmp(pcVar3,*(void **)((long)&ppVar5[uVar16 * 0xf].first._M_str + uVar19),sVar9);
          uVar22 = (uchar)local_a8;
          uVar23 = local_a8._1_1_;
          uVar25 = local_a8._2_1_;
          bVar27 = local_a8._3_1_;
          uVar28 = local_a8._4_1_;
          uVar30 = local_a8._5_1_;
          uVar32 = local_a8._6_1_;
          bVar34 = local_a8._7_1_;
          uVar35 = uStack_a0;
          uVar37 = uStack_9f;
          uVar39 = uStack_9e;
          bVar41 = bStack_9d;
          uVar42 = uStack_9c;
          uVar44 = uStack_9b;
          uVar46 = uStack_9a;
          bVar48 = bStack_99;
          if (iVar11 == 0) goto LAB_002edc3a;
        }
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & local_b8) == 0) {
      return false;
    }
    lVar15 = uVar16 + uVar18;
    uVar18 = uVar18 + 1;
    uVar16 = lVar15 + 1U & local_98;
    if (local_98 < uVar18) {
      return false;
    }
  } while( true );
}

Assistant:

bool Lexer::tryApplyCommentHandler() {
    auto nextWord = [&]() {
        // Skip over leading spaces and tabs.
        while (isTabOrSpace(peek()))
            advance();

        auto start = sourceBuffer;
        while (true) {
            char c = peek();
            if (!isAlphaNumeric(c) && c != '_' && c != '-')
                break;

            advance();
        }

        return std::string_view(start, size_t(sourceBuffer - start));
    };

    auto firstWord = nextWord();
    auto it = options.commentHandlers.find(firstWord);
    if (it == options.commentHandlers.end()) [[likely]]
        return false;

    auto it2 = it->second.find(nextWord());
    if (it2 == it->second.end())
        return false;

    auto loc = [&] { return SourceLocation(bufferId, currentOffset()); };

    auto& handler = it2->second;
    switch (handler.kind) {
        case CommentHandler::Protect:
            // We need to see begin_protected, otherwise we ignore.
            if (nextWord() == "begin_protected"sv) {
                addDiag(diag::ProtectedEnvelope, currentOffset() - lexemeLength());
                scanDisabledRegion(firstWord, "protect", "end_protected", diag::RawProtectEOF);
                return true;
            }
            return false;
        case CommentHandler::TranslateOff:
            scanDisabledRegion(firstWord, handler.endRegion, std::nullopt,
                               diag::UnclosedTranslateOff);
            return true;
        case CommentHandler::LintOff:
            sourceManager.addDiagnosticDirective(loc(), nextWord(), DiagnosticSeverity::Ignored);
            return false;
        case CommentHandler::LintOn:
            sourceManager.addDiagnosticDirective(loc(), nextWord(), DiagnosticSeverity::Warning);
            return false;
        case CommentHandler::LintSave:
            sourceManager.addDiagnosticDirective(loc(), "__push__", DiagnosticSeverity::Ignored);
            return false;
        case CommentHandler::LintRestore:
            sourceManager.addDiagnosticDirective(loc(), "__pop__", DiagnosticSeverity::Ignored);
            return false;
    }
    SLANG_UNREACHABLE;
}